

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long *plVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar7;
  Vec_Str_t *vFixed;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *__s_00;
  word wVar8;
  long lVar9;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  Sfm_Ntk_t *pSVar12;
  int iVar13;
  size_t __n;
  long lVar14;
  
  pVVar6 = Abc_NtkAssignIDs2(pNtk);
  iVar1 = pVVar6->nSize;
  __n = (long)pNtk->vCos->nSize + (long)pNtk->vCis->nSize + (long)iVar1;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  iVar2 = (int)__n;
  iVar13 = 8;
  if (6 < iVar2 - 1U) {
    iVar13 = iVar2;
  }
  vFanins->nSize = 0;
  vFanins->nCap = iVar13;
  if (iVar13 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar13,0x10);
  }
  vFanins->pArray = pVVar7;
  vFanins->nSize = iVar2;
  vFixed = (Vec_Str_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar13 = iVar2;
  }
  vFixed->nSize = 0;
  vFixed->nCap = iVar13;
  if (iVar13 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar13);
  }
  vFixed->pArray = __s;
  vFixed->nSize = iVar2;
  __s_00 = (word *)0x0;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nSize = 0;
  vTruths->nCap = iVar13;
  if (iVar13 != 0) {
    __s_00 = (word *)malloc((long)iVar13 << 3);
  }
  vTruths->pArray = __s_00;
  vTruths->nSize = iVar2;
  memset(__s_00,0,__n * 8);
  if (0 < iVar1) {
    ppvVar3 = pVVar6->pArray;
    lVar14 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar14];
      wVar8 = Abc_SopToTruth((char *)plVar4[7],*(int *)((long)plVar4 + 0x1c));
      iVar2 = (int)plVar4[8];
      if (((long)iVar2 < 0) || (vTruths->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      vTruths->pArray[iVar2] = wVar8;
      if (1 < wVar8 + 1) {
        lVar9 = (long)(int)plVar4[8];
        if ((lVar9 < 0) || (vFanins->nSize <= (int)plVar4[8])) goto LAB_0026ec93;
        pVVar7 = vFanins->pArray + lVar9;
        iVar2 = *(int *)((long)plVar4 + 0x1c);
        if (vFanins->pArray[lVar9].nCap < iVar2) {
          if (pVVar7->pArray == (int *)0x0) {
            piVar10 = (int *)malloc((long)iVar2 << 2);
          }
          else {
            piVar10 = (int *)realloc(pVVar7->pArray,(long)iVar2 << 2);
          }
          pVVar7->pArray = piVar10;
          if (piVar10 == (int *)0x0) goto LAB_0026ecd1;
          pVVar7->nCap = iVar2;
        }
        if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar9 = 0;
          do {
            Vec_IntPush(pVVar7,*(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                                 (long)*(int *)(plVar4[4] + lVar9 * 4) * 8) + 0x40))
            ;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)plVar4 + 0x1c));
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != iVar1);
  }
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar11->pArray[lVar14];
      lVar9 = (long)(int)plVar4[8];
      if ((lVar9 < 0) || (vFanins->nSize <= (int)plVar4[8])) {
LAB_0026ec93:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar7 = vFanins->pArray + lVar9;
      iVar1 = *(int *)((long)plVar4 + 0x1c);
      if (vFanins->pArray[lVar9].nCap < iVar1) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar10 = (int *)malloc((long)iVar1 << 2);
        }
        else {
          piVar10 = (int *)realloc(pVVar7->pArray,(long)iVar1 << 2);
        }
        pVVar7->pArray = piVar10;
        if (piVar10 == (int *)0x0) {
LAB_0026ecd1:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar7->nCap = iVar1;
      }
      if (0 < *(int *)((long)plVar4 + 0x1c)) {
        lVar9 = 0;
        do {
          Vec_IntPush(pVVar7,*(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                               (long)*(int *)(plVar4[4] + lVar9 * 4) * 8) + 0x40));
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)plVar4 + 0x1c));
      }
      lVar14 = lVar14 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar14 < pVVar11->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar14 = 0;
    do {
      pvVar5 = pVVar6->pArray[lVar14];
      if (((pvVar5 != (void *)0x0) && (iPivot <= lVar14)) &&
         ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
        iVar1 = *(int *)((long)pvVar5 + 0x40);
        if (((long)iVar1 < 0) || (vFixed->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        vFixed->pArray[iVar1] = '\x01';
      }
      lVar14 = lVar14 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar14 < pVVar6->nSize);
  }
  pSVar12 = Sfm_NtkConstruct(vFanins,pNtk->vCis->nSize,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,
                             vTruths);
  return pSVar12;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}